

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgc2mgc.cc
# Opt level: O1

void anon_unknown.dwarf_2d5e::PrintUsage(ostream *stream)

{
  long lVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t sVar6;
  
  cVar2 = (char)stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream," mgc2mgc - frequency and generalized cepstral transformation",0x3c);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  usage:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       mgc2mgc [ options ] [ infile ] > stdout",0x2e);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  options:",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -m m  : order of mel-generalized cepstrum (input)            (   int)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)stream,0x19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"][    0 <= m <=     ]",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -a a  : alpha of mel-generalized cepstrum (input)            (double)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"][ -1.0 <  a <  1.0 ]",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -g g  : gamma of mel-generalized cepstrum (input)            (double)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"][ -1.0 <= g <= 1.0 ]",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -c c  : gamma of mel-generalized cepstrum = -1 / c (input)   (   int)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"N/A",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"][    1 <= c <=     ]",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -n    : regard input as normalized mel-generalized cepstrum  (  bool)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  pcVar5 = sptk::ConvertBooleanToString(false);
  iVar3 = (int)stream;
  if (pcVar5 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -u    : regard input as multiplied by gamma                  (  bool)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  pcVar5 = sptk::ConvertBooleanToString(false);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -M M  : order of mel-generalized cepstrum (output)           (   int)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)stream,0x19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"][    0 <= M <=     ]",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -A A  : alpha of mel-generalized cepstrum (output)           (double)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"][ -1.0 <  A <  1.0 ]",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -G G  : gamma of mel-generalized cepstrum (output)           (double)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = std::ostream::_M_insert<double>(1.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"][ -1.0 <= G <= 1.0 ]",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -C C  : gamma of mel-generalized cepstrum = -1 / C (output)  (   int)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"N/A",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"][    1 <= C <=     ]",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -N    : regard output as normalized mel-generalized cepstrum (  bool)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  pcVar5 = sptk::ConvertBooleanToString(false);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -U    : regard output as multiplied by gamma                 (  bool)[",
             0x4d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  pcVar5 = sptk::ConvertBooleanToString(false);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -h    : print this message",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  infile:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,
             "       mel-generalized cepstrum                                     (double)[stdin]",
             0x53);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  stdout:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       transformed mel-generalized cepstrum                         (double)",
             0x4c);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  notice:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,
             "       if -u is used without -n, input is regarded as 1+g*mgc[0],g*mgc[1],...,g*mgc[m]"
             ,0x56);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,
             "       if -U is used without -N, output is regarded as 1+g*mgc[0],g*mgc[1],...,g*mgc[M]"
             ,0x57);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream," SPTK: version ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"4.3",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " mgc2mgc - frequency and generalized cepstral transformation" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       mgc2mgc [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -m m  : order of mel-generalized cepstrum (input)            (   int)[" << std::setw(5) << std::right << kDefaultInputNumOrder  << "][    0 <= m <=     ]" << std::endl;  // NOLINT
  *stream << "       -a a  : alpha of mel-generalized cepstrum (input)            (double)[" << std::setw(5) << std::right << kDefaultInputAlpha     << "][ -1.0 <  a <  1.0 ]" << std::endl;  // NOLINT
  *stream << "       -g g  : gamma of mel-generalized cepstrum (input)            (double)[" << std::setw(5) << std::right << kDefaultInputGamma     << "][ -1.0 <= g <= 1.0 ]" << std::endl;  // NOLINT
  *stream << "       -c c  : gamma of mel-generalized cepstrum = -1 / c (input)   (   int)[" << std::setw(5) << std::right << "N/A"                  << "][    1 <= c <=     ]" << std::endl;  // NOLINT
  *stream << "       -n    : regard input as normalized mel-generalized cepstrum  (  bool)[" << std::setw(5) << std::right << sptk::ConvertBooleanToString(kDefaultInputNormalizationFlag)   << "]" << std::endl;  // NOLINT
  *stream << "       -u    : regard input as multiplied by gamma                  (  bool)[" << std::setw(5) << std::right << sptk::ConvertBooleanToString(kDefaultInputMultiplicationFlag)  << "]" << std::endl;  // NOLINT
  *stream << "       -M M  : order of mel-generalized cepstrum (output)           (   int)[" << std::setw(5) << std::right << kDefaultOutputNumOrder << "][    0 <= M <=     ]" << std::endl;  // NOLINT
  *stream << "       -A A  : alpha of mel-generalized cepstrum (output)           (double)[" << std::setw(5) << std::right << kDefaultOutputAlpha    << "][ -1.0 <  A <  1.0 ]" << std::endl;  // NOLINT
  *stream << "       -G G  : gamma of mel-generalized cepstrum (output)           (double)[" << std::setw(5) << std::right << kDefaultOutputGamma    << "][ -1.0 <= G <= 1.0 ]" << std::endl;  // NOLINT
  *stream << "       -C C  : gamma of mel-generalized cepstrum = -1 / C (output)  (   int)[" << std::setw(5) << std::right << "N/A"                  << "][    1 <= C <=     ]" << std::endl;  // NOLINT
  *stream << "       -N    : regard output as normalized mel-generalized cepstrum (  bool)[" << std::setw(5) << std::right << sptk::ConvertBooleanToString(kDefaultOutputNormalizationFlag)  << "]" << std::endl;  // NOLINT
  *stream << "       -U    : regard output as multiplied by gamma                 (  bool)[" << std::setw(5) << std::right << sptk::ConvertBooleanToString(kDefaultOutputMultiplicationFlag) << "]" << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       mel-generalized cepstrum                                     (double)[stdin]" << std::endl;  // NOLINT
  *stream << "  stdout:" << std::endl;
  *stream << "       transformed mel-generalized cepstrum                         (double)" << std::endl;  // NOLINT
  *stream << "  notice:" << std::endl;
  *stream << "       if -u is used without -n, input is regarded as 1+g*mgc[0],g*mgc[1],...,g*mgc[m]" << std::endl;  // NOLINT
  *stream << "       if -U is used without -N, output is regarded as 1+g*mgc[0],g*mgc[1],...,g*mgc[M]" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}